

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O0

void __thiscall chrono::ChArchiveExplorer::ClearSearch(ChArchiveExplorer *this)

{
  size_type sVar1;
  reference ppCVar2;
  int local_48;
  int i;
  allocator local_31;
  value_type local_30;
  ChArchiveExplorer *local_10;
  ChArchiveExplorer *this_local;
  
  this->found = false;
  this->find_all = false;
  this->found_obj = false;
  this->tablevel = 0;
  local_10 = this;
  std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::clear(&this->results);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->search_tokens);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"",&local_31);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->search_tokens,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::vector<bool,_std::allocator<bool>_>::clear(&this->in_array);
  std::vector<bool,_std::allocator<bool>_>::push_back(&this->in_array,false);
  local_48 = 0;
  while( true ) {
    sVar1 = std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::size(&this->results)
    ;
    if (sVar1 <= (ulong)(long)local_48) break;
    ppCVar2 = std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::operator[]
                        (&this->results,(long)local_48);
    if (*ppCVar2 != (value_type)0x0) {
      (*(*ppCVar2)->_vptr_ChValue[1])();
    }
    local_48 = local_48 + 1;
  }
  return;
}

Assistant:

void ClearSearch() {
        this->found = false;
        this->find_all = false;
        this->found_obj = false;
        this->tablevel = 0;
        this->results.clear();
        this->search_tokens.clear();
        this->search_tokens.push_back(""); // for root lavel
        this->in_array.clear();
        this->in_array.push_back(false); // for root level
        for (int i=0; i<this->results.size(); ++i) {
            delete (this->results[i]);
        }
      }